

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O2

int32 TTD::LookupPositionInDictNameList<Js::DebuggerScope*,true>
                (char16 *key,
                BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *objToNameMap,
                List<Js::DebuggerScope_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *sortedObjList,TTAutoString *nullString)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  DebuggerScope **ppDVar6;
  TTAutoString *pTVar7;
  char16 *pcVar8;
  int iVar9;
  int index;
  
  iVar3 = (sortedObjList->
          super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>).count;
  if (iVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTRuntimeInfoTracker.h"
                       ,0x142,"(sortedObjList.Count() != 0)",
                       "We are using this for matching so obviously no match and there is a problem."
                      );
    if (!bVar2) {
LAB_0082b7de:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    iVar3 = (sortedObjList->
            super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>).count;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  iVar9 = 0;
  iVar3 = iVar3 + -1;
  do {
    index = iVar3;
    if (index <= iVar9) {
      if (iVar9 != index) {
        TTDAbort_unrecoverable_error("Something went wrong!!!");
      }
      ppDVar6 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>::
                Item(&sortedObjList->
                      super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,index);
      pTVar7 = JsUtil::
               BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(objToNameMap,ppDVar6);
      pcVar8 = UtilSupport::TTAutoString::GetStrValue(pTVar7);
      iVar3 = PAL_wcscmp(pcVar8,key);
      if (iVar3 != 0) {
        TTDAbort_unrecoverable_error("We are missing something");
      }
      return index;
    }
    iVar3 = (iVar9 + index) / 2;
    ppDVar6 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&sortedObjList->
                    super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>,
                   iVar3);
    pTVar7 = JsUtil::
             BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Item(objToNameMap,ppDVar6);
    if (index <= iVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTRuntimeInfoTracker.h"
                         ,0x14b,"(imid < imax)","Something went wrong with our indexing.");
      if (!bVar2) goto LAB_0082b7de;
      *puVar5 = 0;
    }
    pcVar8 = UtilSupport::TTAutoString::GetStrValue(pTVar7);
    iVar4 = PAL_wcscmp(pcVar8,key);
    if (iVar4 < 0) {
      iVar9 = iVar3 + 1;
      iVar3 = index;
    }
  } while( true );
}

Assistant:

int32 LookupPositionInDictNameList(const char16* key, const JsUtil::BaseDictionary<T, UtilSupport::TTAutoString*, HeapAllocator>& objToNameMap, const JsUtil::List<T, HeapAllocator>& sortedObjList, const UtilSupport::TTAutoString& nullString)
    {
        AssertMsg(sortedObjList.Count() != 0, "We are using this for matching so obviously no match and there is a problem.");

        int32 imin = 0;
        int32 imax = sortedObjList.Count() - 1;

        while(imin < imax)
        {
            int imid = (imin + imax) / 2;
            const UtilSupport::TTAutoString* imidStr = objToNameMap.Item(sortedObjList.Item(imid));
            AssertMsg(imid < imax, "Something went wrong with our indexing.");

            int32 scmpval = wcscmp(imidStr->GetStrValue(), key);
            if(scmpval < 0)
            {
                imin = imid + 1;
            }
            else
            {
                imax = imid;
            }

        }
        TTDAssert(imin == imax, "Something went wrong!!!");
        
        const UtilSupport::TTAutoString* resStr = objToNameMap.Item(sortedObjList.Item(imin));
        if(mustFind)
        {
            TTDAssert(wcscmp(resStr->GetStrValue(), key) == 0, "We are missing something");
            return imin;
        }
        else
        {
            return (wcscmp(resStr->GetStrValue(), key) == 0) ? imin : -1;
        }
    }